

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBinPacker.cxx
# Opt level: O1

bool cmAllocateCTestResourcesBlock
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>
                *resources,
               vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>
               *allocations)

{
  pointer pcVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer ppcVar4;
  pointer ppcVar5;
  bool bVar6;
  long lVar7;
  cmCTestBinPackerAllocation **ppcVar8;
  _Rb_tree_node_base *p_Var9;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>
  *__range2;
  cmCTestBinPackerAllocation *allocation;
  pointer pcVar10;
  pair<cmCTestBinPackerAllocation_**,_long> pVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resourcesSorted;
  vector<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_> allocationsPtr
  ;
  _TmpBuf __buf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_> local_78;
  _Temporary_buffer<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  
  local_78.
  super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>::reserve
            (&local_78,
             ((long)(allocations->
                    super__Vector_base<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allocations->
                    super__Vector_base<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  pcVar10 = (allocations->
            super__Vector_base<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (allocations->
           super__Vector_base<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar10 != pcVar1) {
    do {
      local_58._M_original_len = (size_type_conflict)pcVar10;
      std::vector<cmCTestBinPackerAllocation*,std::allocator<cmCTestBinPackerAllocation*>>::
      emplace_back<cmCTestBinPackerAllocation*>
                ((vector<cmCTestBinPackerAllocation*,std::allocator<cmCTestBinPackerAllocation*>> *)
                 &local_78,(cmCTestBinPackerAllocation **)&local_58);
      pcVar10 = pcVar10 + 1;
    } while (pcVar10 != pcVar1);
  }
  ppcVar5 = local_78.
            super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppcVar4 = local_78.
            super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_78.
            super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_78.
            super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    lVar7 = (long)local_78.
                  super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_78.
                  super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3;
    pVar11 = std::get_temporary_buffer<cmCTestBinPackerAllocation*>
                       ((lVar7 - (lVar7 + 1 >> 0x3f)) + 1 >> 1);
    lVar7 = pVar11.second;
    ppcVar8 = pVar11.first;
    if (ppcVar8 == (cmCTestBinPackerAllocation **)0x0) {
      lVar7 = 0;
    }
    if (ppcVar8 == (cmCTestBinPackerAllocation **)0x0) {
      local_58._M_original_len = (size_type_conflict)ppcVar5;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppcVar4;
      std::
      __inplace_stable_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<cmCTestBinPackerAllocation**,std::vector<cmCTestBinPackerAllocation*,std::allocator<cmCTestBinPackerAllocation*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::AllocateCTestResources<(anonymous_namespace)::BlockAllocationStrategy>(std::map<std::__cxx11::string,cmCTestResourceAllocator::Resource,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCTestResourceAllocator::Resource>>>const&,std::vector<cmCTestBinPackerAllocation,std::allocator<cmCTestBinPackerAllocation>>&)::_lambda(cmCTestBinPackerAllocation*,cmCTestBinPackerAllocation*)_1_>>
                ();
    }
    else {
      local_58._M_original_len = (size_type_conflict)ppcVar5;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppcVar4;
      std::
      __stable_sort_adaptive<std::reverse_iterator<__gnu_cxx::__normal_iterator<cmCTestBinPackerAllocation**,std::vector<cmCTestBinPackerAllocation*,std::allocator<cmCTestBinPackerAllocation*>>>>,cmCTestBinPackerAllocation**,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::AllocateCTestResources<(anonymous_namespace)::BlockAllocationStrategy>(std::map<std::__cxx11::string,cmCTestResourceAllocator::Resource,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCTestResourceAllocator::Resource>>>const&,std::vector<cmCTestBinPackerAllocation,std::allocator<cmCTestBinPackerAllocation>>&)::_lambda(cmCTestBinPackerAllocation*,cmCTestBinPackerAllocation*)_1_>>
                (&local_58,&local_98,ppcVar8,lVar7);
    }
    operator_delete(ppcVar8,lVar7 << 3);
  }
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_98,(resources->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
  p_Var9 = (resources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  pbVar2 = local_98.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = local_98.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while (local_98.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start = pbVar2,
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar3,
        (_Rb_tree_header *)p_Var9 != &(resources->_M_t)._M_impl.super__Rb_tree_header) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_98,(value_type *)(p_Var9 + 1));
    p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    pbVar2 = local_98.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = local_98.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if ((long)pbVar3 - (long)pbVar2 != 0) {
    lVar7 = (long)pbVar3 - (long)pbVar2 >> 5;
    local_30._M_current = pbVar3;
    std::
    _Temporary_buffer<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Temporary_buffer(&local_58,
                        (reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&local_30,(lVar7 - (lVar7 + 1 >> 0x3f)) + 1 >> 1);
    local_40._M_current = pbVar2;
    local_38._M_current = pbVar3;
    if (local_58._M_buffer ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      __inplace_stable_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::BlockAllocationStrategy::InitialSort(std::map<std::__cxx11::string,cmCTestResourceAllocator::Resource,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCTestResourceAllocator::Resource>>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>>
                ((reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&local_38,
                 (reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&local_40,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_CTest_cmCTestBinPacker_cxx:170:5)>
                  )resources);
    }
    else {
      std::
      __stable_sort_adaptive<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__cxx11::string*,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::BlockAllocationStrategy::InitialSort(std::map<std::__cxx11::string,cmCTestResourceAllocator::Resource,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCTestResourceAllocator::Resource>>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>>
                ((reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&local_38,
                 (reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&local_40,local_58._M_buffer,local_58._M_len,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_CTest_cmCTestBinPacker_cxx:170:5)>
                  )resources);
    }
    std::
    _Temporary_buffer<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Temporary_buffer(&local_58);
  }
  bVar6 = anon_unknown.dwarf_5b2119::
          AllocateCTestResources<(anonymous_namespace)::BlockAllocationStrategy>
                    (resources,&local_98,0,&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  if ((pointer)local_78.
               super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>
               ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<cmCTestBinPackerAllocation_*,_std::allocator<cmCTestBinPackerAllocation_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar6;
}

Assistant:

bool cmAllocateCTestResourcesBlock(
  const std::map<std::string, cmCTestResourceAllocator::Resource>& resources,
  std::vector<cmCTestBinPackerAllocation>& allocations)
{
  return AllocateCTestResources<BlockAllocationStrategy>(resources,
                                                         allocations);
}